

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::showResolvedHand(Dice *this)

{
  pair<const_Dice::DiceOptions,_int> pVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppVar4;
  void *this_00;
  int iStack_34;
  pair<const_Dice::DiceOptions,_int> hand;
  iterator __end1;
  iterator __begin1;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *__range1;
  int index;
  Dice *this_local;
  
  __range1._4_4_ = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Current resolved items -------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::begin(&this->resolvedHand);
  hand = (pair<const_Dice::DiceOptions,_int>)
         std::
         map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
         ::end(&this->resolvedHand);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&hand);
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::operator*(&__end1);
    pVar1 = *ppVar4;
    poVar3 = std::operator<<((ostream *)&std::cout,this->DiceNames[__range1._4_4_]);
    poVar3 = std::operator<<(poVar3," : ");
    iStack_34 = pVar1.second;
    this_00 = (void *)std::ostream::operator<<(poVar3,iStack_34);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::operator++(&__end1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"----------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Dice::showResolvedHand() {
    int index = 0;
    cout << "Current resolved items -------" << endl;
    for (auto hand : resolvedHand) {
        cout << DiceNames[index] << " : " << hand.second << endl;
        index++;
    }
    cout << "----------------------------" << endl;

}